

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

size_t __thiscall FileWriter::Printf(FileWriter *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  FString out;
  va_list ap;
  FString local_e0;
  __va_list_tag local_d8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_e0.Chars = FString::NullString.Nothing;
  local_d8.gp_offset = 0x10;
  local_d8.fp_offset = 0x30;
  local_d8.overflow_arg_area = &out;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  FString::VFormat(&local_e0,fmt,&local_d8);
  iVar1 = (*this->_vptr_FileWriter[2])
                    (this,local_e0.Chars,(ulong)((FNullStringData *)(local_e0.Chars + -0xc))->Len);
  FString::~FString(&local_e0);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t FileWriter::Printf(const char *fmt, ...)
{
	va_list ap;
	FString out;

	va_start(ap, fmt);
	out.VFormat(fmt, ap);
	va_end(ap);
	return Write(out.GetChars(), out.Len());
}